

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<double>::AddKel
          (TPZFrontSym<double> *this,TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  lVar1 = destinationindex->fNElements;
  if (0 < lVar1) {
    lVar10 = 0;
    do {
      iVar4 = Local(this,destinationindex->fStore[lVar10]);
      lVar8 = (long)iVar4;
      lVar9 = lVar10;
      do {
        iVar4 = Local(this,destinationindex->fStore[lVar9]);
        lVar2 = (elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar2 <= lVar10) ||
           ((elmat->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar6 = (long)iVar4;
        lVar5 = lVar6;
        if (lVar6 < lVar8) {
          lVar5 = lVar8;
        }
        if (lVar8 < lVar6) {
          lVar6 = lVar8;
        }
        lVar5 = (lVar5 + 1) * lVar5;
        uVar7 = lVar5 - (lVar5 >> 0x3f) & 0xfffffffffffffffe;
        pdVar3 = (this->super_TPZFront<double>).fData.fStore;
        *(double *)((long)pdVar3 + lVar6 * 8 + uVar7 * 4) =
             elmat->fElem[lVar2 * lVar9 + lVar10] +
             *(double *)((long)pdVar3 + lVar6 * 8 + uVar7 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 < lVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar1);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel = destinationindex.NElements();
	for(i=0;i<nel;i++){
		ilocal = this->Local(destinationindex[i]);
		for(j=i;j<nel;j++) {
			jlocal=this->Local(destinationindex[j]);
			this->Element(ilocal, jlocal)+=elmat(i,j);
		}
	}
	/*
	 output << "Dest Index " ;
	 for(i=0;i<nel;i++) output << destinationindex[i] << " ";
	 output << endl;
	 elmat.Print("Element matrix ",output);
	 PrintGlobal("After Assemb..." , output);
	 */
}